

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcache1EnforceMaxPage(PCache1 *pCache)

{
  uint *puVar1;
  PGroup *pPVar2;
  PgHdr1 *pPage;
  PgHdr1 *pPVar3;
  
  pPVar2 = pCache->pGroup;
  while ((pPVar2->nMaxPage < pPVar2->nPurgeable &&
         (pPage = (pPVar2->lru).pLruPrev, pPage->isAnchor == 0))) {
    pPVar3 = pPage->pLruPrev;
    pPVar3->pLruNext = pPage->pLruNext;
    pPage->pLruNext->pLruPrev = pPVar3;
    pPage->pLruNext = (PgHdr1 *)0x0;
    puVar1 = &pPage->pCache->nRecyclable;
    *puVar1 = *puVar1 - 1;
    pcache1RemoveFromHash(pPage,1);
  }
  if ((pCache->nPage == 0) && (pCache->pBulk != (void *)0x0)) {
    sqlite3_free(pCache->pBulk);
    pCache->pFree = (PgHdr1 *)0x0;
    pCache->pBulk = (void *)0x0;
  }
  return;
}

Assistant:

static void pcache1EnforceMaxPage(PCache1 *pCache){
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *p;
  assert( sqlite3_mutex_held(pGroup->mutex) );
  while( pGroup->nPurgeable>pGroup->nMaxPage
      && (p=pGroup->lru.pLruPrev)->isAnchor==0
  ){
    assert( p->pCache->pGroup==pGroup );
    assert( PAGE_IS_UNPINNED(p) );
    pcache1PinPage(p);
    pcache1RemoveFromHash(p, 1);
  }
  if( pCache->nPage==0 && pCache->pBulk ){
    sqlite3_free(pCache->pBulk);
    pCache->pBulk = pCache->pFree = 0;
  }
}